

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::KcpConnection::handleKcpClose(KcpConnection *this)

{
  LogLevel LVar1;
  sz_sock v;
  int __args_1;
  LogStream *pLVar2;
  self *psVar3;
  char *str;
  bool bVar4;
  SourceFile file;
  undefined1 local_1038 [8];
  KcpConnectionPtr guardThis;
  int oldState;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  KcpConnection *local_10;
  KcpConnection *this_local;
  
  local_10 = this;
  EventLoop::assertInLoopThread(this->m_loop);
  LVar1 = Logger::logLevel();
  if ((int)LVar1 < 1) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_ff0,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x193,TRACE,"handleKcpClose");
    pLVar2 = Logger::stream(&local_fe0);
    psVar3 = LogStream::operator<<(pLVar2,"fd = ");
    v = Socket::fd(&this->m_udpSocket);
    pLVar2 = LogStream::operator<<(psVar3,v);
    psVar3 = LogStream::operator<<(pLVar2," state = ");
    str = stateToString(this);
    LogStream::operator<<(psVar3,str);
    Logger::~Logger(&local_fe0);
  }
  __args_1 = implicit_cast<int,sznet::net::KcpConnection::StateE>(&this->m_state);
  bVar4 = true;
  if ((this->m_state != kConnected) && (bVar4 = true, this->m_state != kConnecting)) {
    bVar4 = this->m_state == kDisconnecting;
  }
  if (!bVar4) {
    __assert_fail("m_state == kConnected || m_state == kConnecting || m_state == kDisconnecting",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
                  ,0x195,"void sznet::net::KcpConnection::handleKcpClose()");
  }
  setState(this,kDisconnected);
  EventLoop::cancel(this->m_loop,this->m_kcpUpdateTimerId);
  guardThis.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->m_verifyTimerId).m_timer;
  EventLoop::cancel(this->m_loop,this->m_verifyTimerId);
  std::enable_shared_from_this<sznet::net::KcpConnection>::shared_from_this
            ((enable_shared_from_this<sznet::net::KcpConnection> *)local_1038);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator()
            (&this->m_kcpConnectionCallback,(shared_ptr<sznet::net::KcpConnection> *)local_1038);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>::operator()
            (&this->m_kcpCloseCallback,(shared_ptr<sznet::net::KcpConnection> *)local_1038,__args_1)
  ;
  std::shared_ptr<sznet::net::KcpConnection>::~shared_ptr
            ((shared_ptr<sznet::net::KcpConnection> *)local_1038);
  return;
}

Assistant:

void KcpConnection::handleKcpClose()
{
	m_loop->assertInLoopThread();
	LOG_TRACE << "fd = " << m_udpSocket.fd() << " state = " << stateToString();
	int oldState = implicit_cast<int>(m_state);
	assert(m_state == kConnected || m_state == kConnecting || m_state == kDisconnecting);
	// we don't close fd, leave it to dtor, so we can find leaks easily.
	setState(kDisconnected);
	
	// ���ͷ���
	m_loop->cancel(m_kcpUpdateTimerId);
	m_loop->cancel(m_verifyTimerId);

	// ��ֹ��ǰ�ͷţ����ɲ���Ԥ��������
	KcpConnectionPtr guardThis(shared_from_this());
	m_kcpConnectionCallback(guardThis);
	// must be the last line
	m_kcpCloseCallback(guardThis, oldState);
}